

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax-test.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  char cVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined1 auVar6 [8];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 local_178 [8];
  TokenReader reader;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  __shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> local_98;
  undefined1 local_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  testCases;
  undefined1 auStack_68 [8];
  Ptr node;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator_type local_31;
  
  node.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)local_178,"int age = 40",(allocator *)auStack_68);
  std::__cxx11::string::string
            ((string *)&reader.pos,"int arg, b = 23, a=3,c",(allocator *)&local_98);
  std::__cxx11::string::string(local_138,"int a = 2 + 3 *5 + 8 + 9 *100",&local_36);
  std::__cxx11::string::string(local_118,"int a = 2 + ((3 +5)*9 + (9 - 2))",&local_35);
  std::__cxx11::string::string(local_f8,"int b = 2 + 3 +5",&local_34);
  std::__cxx11::string::string(local_d8,"int ",&local_33);
  std::__cxx11::string::string(local_b8,"int",&local_32);
  __l._M_len = 7;
  __l._M_array = (iterator)local_178;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_88,__l,&local_31);
  lVar3 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)(local_178 + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  testCases.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       testCases.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  for (auVar6 = local_88;
      auVar6 != (undefined1  [8])
                testCases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      auVar6 = (undefined1  [8])((long)auVar6 + 0x20)) {
    grammar_analyze((string *)auVar6,
                    (vector *)
                    &node.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    for (_Var5 = node.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        _Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Var5._M_pi = _Var5._M_pi + 0x28) {
      type2str_abi_cxx11_((TokenType *)local_178);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_178);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,(string *)(_Var5._M_pi + 8));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)local_178);
    }
    auStack_68 = (undefined1  [8])0x0;
    node.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    TokenReader::TokenReader
              ((TokenReader *)local_178,
               (vector<Token,_std::allocator<Token>_> *)
               &node.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Singleton<SimpleSyntaxAnalyzer>::instance();
    SimpleSyntaxAnalyzer::analyze((TokenReader *)&local_98);
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)auStack_68,&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    if (auStack_68 != (undefined1  [8])0x0) {
      SimpleASTNode::print(auStack_68._0_4_);
    }
    std::vector<Token,_std::allocator<Token>_>::erase
              ((vector<Token,_std::allocator<Token>_> *)
               &node.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (const_iterator)
               node.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
               (const_iterator)0x0);
    cVar1 = TokenReader::empty();
    pcVar4 = "TokenReader still has items\n";
    if (cVar1 != '\0') {
      pcVar4 = "TokenReader is empty\n";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::vector<Token,_std::allocator<Token>_>::~vector
              ((vector<Token,_std::allocator<Token>_> *)local_178);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&node);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  std::vector<Token,_std::allocator<Token>_>::~vector
            ((vector<Token,_std::allocator<Token>_> *)
             &node.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return 0;
}

Assistant:

int main(int, char**) {
    std::vector<Token> res = {};

    std::vector<std::string> testCases = {"int age = 40", "int arg, b = 23, a=3,c", "int a = 2 + 3 *5 + 8 + 9 *100", \
    "int a = 2 + ((3 +5)*9 + (9 - 2))", "int b = 2 + 3 +5", "int ", "int"};

    for (auto& item : testCases) {
        grammar_analyze(item, res);
        for (std::vector<Token>::iterator iter = res.begin(); iter != res.end(); iter++)
            std::cout << type2str(iter->type) << ": " << iter->val << std::endl;
        SimpleASTNode::Ptr node;
        TokenReader reader(res);
        try {
            node = SimpleSyntaxAnalyzer::instance()->analyze(reader);
        } catch (std::exception& e) {
            std::cout << e.what() << std::endl;
            exit(1);
        }

        if (node != nullptr)
            node->print(0);
        res.erase(res.begin(), res.end());
        std::cout << (reader.empty() ? "TokenReader is empty\n" : "TokenReader still has items\n") << std::endl;
    }
    return 0;
}